

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildRender1bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uchar in_marker_pixel_value)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uchar uVar5;
  
  if ((x < 0) || (atlas->TexWidth < w + x)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x952,"ImFontAtlasBuildRender1bppRectFromString","ImGui ASSERT FAILED: %s",
                "x >= 0 && x + w <= atlas->TexWidth");
  }
  if ((y < 0) || (atlas->TexHeight < h + y)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x953,"ImFontAtlasBuildRender1bppRectFromString","ImGui ASSERT FAILED: %s",
                "y >= 0 && y + h <= atlas->TexHeight");
  }
  puVar1 = atlas->TexPixelsAlpha8 + (long)y * (long)atlas->TexWidth + (long)x;
  iVar2 = 0;
  uVar3 = 0;
  if (0 < w) {
    uVar3 = (ulong)(uint)w;
  }
  if (h < 1) {
    h = 0;
  }
  for (; iVar2 != h; iVar2 = iVar2 + 1) {
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      uVar5 = in_marker_pixel_value;
      if (in_str[uVar4] != in_marker_char) {
        uVar5 = '\0';
      }
      puVar1[uVar4] = uVar5;
    }
    puVar1 = puVar1 + atlas->TexWidth;
    in_str = in_str + w;
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender1bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned char in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned char* out_pixel = atlas->TexPixelsAlpha8 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : 0x00;
}